

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O0

basic_string_view<char> __thiscall fmt::v10::operator()(v10 *this)

{
  basic_string_view<char> bVar1;
  FMT_COMPILE_STRING *this_local;
  
  bVar1 = detail_exported::compile_string_to_view<char,23ul>
                    ((char (*) [23])"CBOR map insert string");
  return bVar1;
}

Assistant:

Error CborMap::Get(int aKey, CborMap &aMap) const
{
    cn_cbor *cbor = cn_cbor_mapget_int(mCbor, aKey);
    if (cbor == nullptr)
    {
        return ERROR_NOT_FOUND("CBOR map cannot find entry of {}", aKey);
    }

    aMap.mIsRoot = false;
    aMap.mCbor   = cbor;
    return ERROR_NONE;
}